

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

OBS_TYPE __thiscall
despot::Parser::GetPOMDPXObservation
          (Parser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *observe)

{
  pointer pcVar1;
  int iVar2;
  mapped_type *pmVar3;
  OBS_TYPE OVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pNVar7;
  long lVar8;
  string local_50;
  
  pNVar7 = (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_finish == pNVar7) {
    OVar4 = 0;
  }
  else {
    lVar8 = 0;
    uVar6 = 0;
    OVar4 = 0;
    do {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](observe,(key_type *)((long)&(pNVar7->name_)._M_dataplus._M_p + lVar8));
      pcVar1 = (pmVar3->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + pmVar3->_M_string_length);
      iVar2 = Variable::IndexOf((Variable *)((long)&(pNVar7->super_Variable)._vptr_Variable + lVar8)
                                ,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pNVar7 = (this->obs_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      OVar4 = (long)iVar2 +
              OVar4 * (long)(int)((ulong)(*(long *)((long)&(pNVar7->super_Variable).values_.
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + lVar8
                                                  ) -
                                         *(long *)((long)&(pNVar7->super_Variable).values_.
                                                                                                                    
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar8)
                                         ) >> 5);
      uVar6 = uVar6 + 1;
      uVar5 = ((long)(this->obs_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pNVar7 >> 3) * -0x1111111111111111;
      lVar8 = lVar8 + 0x78;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  return OVar4;
}

Assistant:

OBS_TYPE Parser::GetPOMDPXObservation(map<string, string>& observe) {
	OBS_TYPE obs = 0;
	for (int o = 0; o < obs_vars_.size(); o++) {
		int index = obs_vars_[o].IndexOf(observe[obs_vars_[o].name()]);
		obs = obs * obs_vars_[o].Size() + index;
	}
	return obs;
}